

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compatibility.cpp
# Opt level: O0

void CheckCompatibility(MapData *map)

{
  FMD5Holder key;
  bool bVar1;
  bool bVar2;
  int iVar3;
  FCompatValues *pFVar4;
  ulong local_48;
  size_t j;
  bool onlyparams;
  FCompatValues *flags;
  FMD5Holder md5;
  MapData *map_local;
  
  bVar1 = true;
  md5._8_8_ = map;
  iVar3 = FWadCollection::GetLumpFile(&Wads,map->lumpnum);
  if (((iVar3 == 1) && ((gameinfo.flags & 0x10U) != 0)) && (level.maptype == MAPTYPE_DOOM)) {
    ii_compatflags = 0x20000001;
    if ((gameinfo.flags & 0x20U) != 0) {
      ii_compatflags = 0x20000003;
    }
    ii_compatflags2 = 0;
    ib_compatflags = 0;
    ii_compatparams = -1;
  }
  else {
    iVar3 = FWadCollection::GetLumpFile(&Wads,*(int *)(md5._8_8_ + 0xd4));
    if (((iVar3 == 1) && ((gameinfo.flags & 0x40U) != 0)) &&
       (bVar2 = FWadCollection::CheckLumpName(&Wads,*(int *)(md5._8_8_ + 0xd4),"MAP36"), bVar2)) {
      ii_compatflags = 0x40000000;
      ii_compatflags2 = 0;
      ib_compatflags = 0;
      ii_compatparams = -1;
    }
    else {
      iVar3 = FWadCollection::GetLumpFile(&Wads,*(int *)(md5._8_8_ + 0xd4));
      if (((iVar3 == 2) && ((gameinfo.flags & 0x80U) != 0)) &&
         (bVar2 = FWadCollection::CheckLumpName(&Wads,*(int *)(md5._8_8_ + 0xd4),"MAP47"), bVar2)) {
        ii_compatflags = 0x40000000;
        ii_compatflags2 = 0;
        ib_compatflags = 0;
        ii_compatparams = -1;
      }
      else {
        bVar1 = false;
      }
    }
  }
  MapData::GetChecksum((MapData *)md5._8_8_,(BYTE *)&flags);
  key._8_8_ = md5._0_8_;
  key._0_8_ = flags;
  pFVar4 = TMap<FMD5Holder,_FCompatValues,_FMD5HashTraits,_TValueTraits<FCompatValues>_>::CheckKey
                     (&BCompatMap,key);
  iVar3 = FIntCVar::operator_cast_to_int(&developer);
  if (2 < iVar3) {
    Printf("MD5 = ");
    for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 1) {
      Printf("%02X",(ulong)*(byte *)((long)&flags + local_48));
    }
    if (pFVar4 == (FCompatValues *)0x0) {
      Printf("\n");
    }
    else {
      Printf(", cflags = %08x, cflags2 = %08x, bflags = %08x\n",(ulong)(uint)pFVar4->CompatFlags[0],
             (ulong)(uint)pFVar4->CompatFlags[1],(ulong)(uint)pFVar4->CompatFlags[2]);
    }
  }
  if (pFVar4 == (FCompatValues *)0x0) {
    if (!bVar1) {
      ii_compatflags = 0;
      ii_compatflags2 = 0;
      ib_compatflags = 0;
    }
    ii_compatparams = -1;
  }
  else {
    if (!bVar1) {
      ii_compatflags = pFVar4->CompatFlags[0];
      ii_compatflags2 = pFVar4->CompatFlags[1];
      ib_compatflags = pFVar4->CompatFlags[2];
    }
    ii_compatparams = pFVar4->ExtCommandIndex;
  }
  FBaseCVar::Callback(&compatflags.super_FBaseCVar);
  FBaseCVar::Callback(&compatflags2.super_FBaseCVar);
  if ((level.flags2 & 0x800000) != 0) {
    ib_compatflags = ib_compatflags | 0x100;
  }
  return;
}

Assistant:

void CheckCompatibility(MapData *map)
{
	FMD5Holder md5;
	FCompatValues *flags;
	bool onlyparams = true;

	// When playing Doom IWAD levels force COMPAT_SHORTTEX and COMPATF_LIGHT.
	// I'm not sure if the IWAD maps actually need COMPATF_LIGHT but it certainly does not hurt.
	// TNT's MAP31 also needs COMPATF_STAIRINDEX but that only gets activated for TNT.WAD.
	if (Wads.GetLumpFile(map->lumpnum) == 1 && (gameinfo.flags & GI_COMPATSHORTTEX) && level.maptype == MAPTYPE_DOOM)
	{
		ii_compatflags = COMPATF_SHORTTEX|COMPATF_LIGHT;
		if (gameinfo.flags & GI_COMPATSTAIRS) ii_compatflags |= COMPATF_STAIRINDEX;
		ii_compatflags2 = 0;
		ib_compatflags = 0;
		ii_compatparams = -1;
	}
	else if (Wads.GetLumpFile(map->lumpnum) == 1 && (gameinfo.flags & GI_COMPATPOLY1) && Wads.CheckLumpName(map->lumpnum, "MAP36"))
	{
		ii_compatflags = COMPATF_POLYOBJ;
		ii_compatflags2 = 0;
		ib_compatflags = 0;
		ii_compatparams = -1;
	}
	else if (Wads.GetLumpFile(map->lumpnum) == 2 && (gameinfo.flags & GI_COMPATPOLY2) && Wads.CheckLumpName(map->lumpnum, "MAP47"))
	{
		ii_compatflags = COMPATF_POLYOBJ;
		ii_compatflags2 = 0;
		ib_compatflags = 0;
		ii_compatparams = -1;
	}
	else
	{
		onlyparams = false;
	}

	map->GetChecksum(md5.Bytes);

	flags = BCompatMap.CheckKey(md5);

	if (developer >= DMSG_NOTIFY)
	{
		Printf("MD5 = ");
		for (size_t j = 0; j < sizeof(md5.Bytes); ++j)
		{
			Printf("%02X", md5.Bytes[j]);
		}
		if (flags != NULL)
		{
			Printf(", cflags = %08x, cflags2 = %08x, bflags = %08x\n",
				flags->CompatFlags[SLOT_COMPAT], flags->CompatFlags[SLOT_COMPAT2], flags->CompatFlags[SLOT_BCOMPAT]);
		}
		else
		{
			Printf("\n");
		}
	}

	if (flags != NULL)
	{
		if (!onlyparams)
		{
			ii_compatflags = flags->CompatFlags[SLOT_COMPAT];
			ii_compatflags2 = flags->CompatFlags[SLOT_COMPAT2];
			ib_compatflags = flags->CompatFlags[SLOT_BCOMPAT];
		}
		ii_compatparams = flags->ExtCommandIndex;
	}
	else
	{
		if (!onlyparams)
		{
			ii_compatflags = 0;
			ii_compatflags2 = 0;
			ib_compatflags = 0;
		}
		ii_compatparams = -1;
	}
	// Reset i_compatflags
	compatflags.Callback();
	compatflags2.Callback();
	// Set floatbob compatibility for all maps with an original Hexen MAPINFO.
	if (level.flags2 & LEVEL2_HEXENHACK)
	{
		ib_compatflags |= BCOMPATF_FLOATBOB;
	}
}